

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O1

bool __thiscall
Diligent::PipelineResourceSignatureGLImpl::DvpValidateCommittedResource
          (PipelineResourceSignatureGLImpl *this,GLResourceAttribs *GLAttribs,
          RESOURCE_DIMENSION ResourceDim,bool IsMultisample,Uint32 ResIndex,
          ShaderResourceCacheGL *ResourceCache,char *ShaderName,char *PSOName)

{
  char *pcVar1;
  PipelineResourceAttribsType *pPVar2;
  bool bVar3;
  int iVar4;
  BINDING_RANGE BVar5;
  Uint32 UVar6;
  CachedUB *pCVar7;
  CachedResourceView *pCVar8;
  ITextureView *pIVar9;
  IBufferView *pIVar10;
  CachedSSBO *pCVar11;
  undefined7 in_register_00000009;
  char (*Args_1) [41];
  bool bVar12;
  uint uVar13;
  Uint32 ArrayIndex;
  char (*Args_2) [14];
  Uint32 UVar14;
  PipelineResourceDesc *pPVar15;
  char (*in_stack_ffffffffffffff58) [2];
  string msg;
  String local_68;
  undefined8 local_48;
  PipelineResourceDesc *local_40;
  PipelineResourceAttribsType *local_38;
  
  Args_2 = (char (*) [14])(ulong)ResIndex;
  Args_1 = (char (*) [41])CONCAT71(in_register_00000009,IsMultisample);
  uVar13 = (uint)ResourceDim;
  if ((this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < m_Desc.NumResources",(char (*) [31])Args_1);
    Args_1 = (char (*) [41])0x221;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
               ,0x221);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pPVar15 = (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
            .m_Desc.Resources;
  local_38 = (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
             m_pResourceAttribs + ResIndex;
  iVar4 = strcmp(pPVar15[ResIndex].Name,GLAttribs->Name);
  if (iVar4 != 0) {
    FormatString<char[28]>(&msg,(char (*) [28])"Inconsistent resource names");
    Args_1 = (char (*) [41])0x224;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
               ,0x224);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pPVar15 = pPVar15 + ResIndex;
  if (pPVar15->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
    if (pPVar15->ArraySize < GLAttribs->ArraySize) {
      FormatString<char[26],char[41]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GLAttribs.ArraySize <= ResDesc.ArraySize",Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                 ,0x229);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    BVar5 = PipelineResourceToBindingRange(pPVar15);
    local_40 = pPVar15;
    switch(BVar5) {
    case BINDING_RANGE_UNIFORM_BUFFER:
      if (GLAttribs->ArraySize != 0) {
        UVar14 = 0;
        bVar12 = true;
        do {
          ArrayIndex = (Uint32)Args_2;
          UVar6 = local_38->CacheOffset + UVar14;
          if (UVar6 < ResourceCache->m_TexturesOffset / 0x18) {
            pCVar7 = ShaderResourceCacheGL::GetConstUB(ResourceCache,UVar6);
            ArrayIndex = (Uint32)Args_2;
            if ((pCVar7->pBuffer).m_pObject == (BufferGLImpl *)0x0) goto LAB_002d05dd;
          }
          else {
LAB_002d05dd:
            GetShaderResourcePrintName_abi_cxx11_
                      (&local_68,(Diligent *)GLAttribs->Name,(char *)(ulong)GLAttribs->ArraySize,
                       UVar14,ArrayIndex);
            Args_2 = (char (*) [14])&ShaderName;
            FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                      (&msg,(Diligent *)"No resource is bound to variable \'",
                       (char (*) [35])&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\' in shader \'",Args_2,(char **)"\' of PSO \'",(char (*) [11])&PSOName,
                       (char **)0x7fecee,in_stack_ffffffffffffff58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char (*) [14])0x0;
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            bVar12 = false;
          }
          UVar14 = UVar14 + 1;
          if (GLAttribs->ArraySize <= UVar14) {
            return bVar12;
          }
        } while( true );
      }
      break;
    case BINDING_RANGE_TEXTURE:
      if (GLAttribs->ArraySize != 0) {
        UVar14 = 0;
        bVar12 = true;
        local_48 = this;
        do {
          pPVar2 = local_38;
          UVar6 = (Uint32)Args_2;
          bVar3 = ShaderResourceCacheGL::IsTextureBound
                            (ResourceCache,local_38->CacheOffset + UVar14,
                             pPVar15->ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT ||
                             pPVar15->ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV);
          if (bVar3) {
            pCVar8 = ShaderResourceCacheGL::GetConstTexture
                               (ResourceCache,pPVar2->CacheOffset + UVar14);
            pcVar1 = GLAttribs->Name;
            UVar6 = GLAttribs->ArraySize;
            if (pCVar8->pTexture == (TextureBaseGL *)0x0) {
              pIVar10 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::IBufferView>
                                  (&pCVar8->pView);
              Args_2 = (char (*) [14])(ulong)uVar13;
              ValidateResourceViewDimension<Diligent::IBufferView>
                        (pcVar1,UVar6,UVar14,pIVar10,ResourceDim,IsMultisample);
            }
            else {
              pIVar9 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::ITextureView>
                                 (&pCVar8->pView);
              Args_2 = (char (*) [14])(ulong)uVar13;
              ValidateResourceViewDimension<Diligent::ITextureView>
                        (pcVar1,UVar6,UVar14,pIVar9,ResourceDim,IsMultisample);
            }
            UVar6 = GetImmutableSamplerIdx(local_48,local_38);
            pPVar15 = local_40;
            if (UVar6 != 0xffffffff) {
              if ((pCVar8->field_2).pBuffer == (BufferGLImpl *)0x0) {
                FormatString<char[66]>
                          (&msg,(char (*) [66])
                                "Immutable sampler is not initialized in the cache - this is a bug")
                ;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                           ,0x25d);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
              }
              if ((pCVar8->field_2).pBuffer !=
                  (BufferGLImpl *)
                  (local_48->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                  m_pImmutableSamplers[UVar6].m_pObject) {
                FormatString<char[56]>
                          (&msg,(char (*) [56])
                                "Immutable sampler initialized in the cache is not valid");
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                           ,0x25e);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
          else {
            GetShaderResourcePrintName_abi_cxx11_
                      (&local_68,(Diligent *)GLAttribs->Name,(char *)(ulong)GLAttribs->ArraySize,
                       UVar14,UVar6);
            Args_2 = (char (*) [14])&ShaderName;
            FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                      (&msg,(Diligent *)"No resource is bound to variable \'",
                       (char (*) [35])&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\' in shader \'",Args_2,(char **)"\' of PSO \'",(char (*) [11])&PSOName,
                       (char **)0x7fecee,in_stack_ffffffffffffff58);
            pPVar15 = local_40;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char (*) [14])0x0;
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            bVar12 = false;
          }
          UVar14 = UVar14 + 1;
        } while (UVar14 < GLAttribs->ArraySize);
        return bVar12;
      }
      break;
    case BINDING_RANGE_IMAGE:
      if (GLAttribs->ArraySize != 0) {
        bVar12 = true;
        UVar14 = 0;
        local_48 = (PipelineResourceSignatureGLImpl *)CONCAT44(local_48._4_4_,uVar13);
        do {
          pPVar2 = local_38;
          UVar6 = (Uint32)Args_2;
          bVar3 = ShaderResourceCacheGL::IsImageBound
                            (ResourceCache,local_38->CacheOffset + UVar14,
                             (pPVar15->ResourceType - SHADER_RESOURCE_TYPE_TEXTURE_SRV & 0xfd) == 0)
          ;
          if (bVar3) {
            pCVar8 = ShaderResourceCacheGL::GetConstImage
                               (ResourceCache,pPVar2->CacheOffset + UVar14);
            pcVar1 = GLAttribs->Name;
            UVar6 = GLAttribs->ArraySize;
            if (pCVar8->pTexture == (TextureBaseGL *)0x0) {
              pIVar10 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::IBufferView>
                                  (&pCVar8->pView);
              Args_2 = (char (*) [14])((ulong)local_48 & 0xffffffff);
              ValidateResourceViewDimension<Diligent::IBufferView>
                        (pcVar1,UVar6,UVar14,pIVar10,(RESOURCE_DIMENSION)local_48,IsMultisample);
              pPVar15 = local_40;
            }
            else {
              pIVar9 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::ITextureView>
                                 (&pCVar8->pView);
              Args_2 = (char (*) [14])((ulong)local_48 & 0xffffffff);
              ValidateResourceViewDimension<Diligent::ITextureView>
                        (pcVar1,UVar6,UVar14,pIVar9,(RESOURCE_DIMENSION)local_48,IsMultisample);
              pPVar15 = local_40;
            }
          }
          else {
            GetShaderResourcePrintName_abi_cxx11_
                      (&local_68,(Diligent *)GLAttribs->Name,(char *)(ulong)GLAttribs->ArraySize,
                       UVar14,UVar6);
            Args_2 = (char (*) [14])&ShaderName;
            FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                      (&msg,(Diligent *)"No resource is bound to variable \'",
                       (char (*) [35])&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\' in shader \'",Args_2,(char **)"\' of PSO \'",(char (*) [11])&PSOName,
                       (char **)0x7fecee,in_stack_ffffffffffffff58);
            pPVar15 = local_40;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char (*) [14])0x0;
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            bVar12 = false;
          }
          UVar14 = UVar14 + 1;
        } while (UVar14 < GLAttribs->ArraySize);
        return bVar12;
      }
      break;
    case BINDING_RANGE_STORAGE_BUFFER:
      if (GLAttribs->ArraySize != 0) {
        UVar14 = 0;
        bVar12 = true;
        do {
          UVar6 = (Uint32)Args_2;
          uVar13 = local_38->CacheOffset + UVar14;
          if (uVar13 < (uint)((ulong)ResourceCache->m_MemoryEndOffset -
                              (ulong)ResourceCache->m_SSBOsOffset >> 4)) {
            pCVar11 = ShaderResourceCacheGL::GetConstSSBO(ResourceCache,uVar13);
            UVar6 = (Uint32)Args_2;
            if ((pCVar11->pBufferView).m_pObject == (BufferViewGLImpl *)0x0) goto LAB_002d086f;
          }
          else {
LAB_002d086f:
            GetShaderResourcePrintName_abi_cxx11_
                      (&local_68,(Diligent *)GLAttribs->Name,(char *)(ulong)GLAttribs->ArraySize,
                       UVar14,UVar6);
            Args_2 = (char (*) [14])&ShaderName;
            FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                      (&msg,(Diligent *)"No resource is bound to variable \'",
                       (char (*) [35])&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\' in shader \'",Args_2,(char **)"\' of PSO \'",(char (*) [11])&PSOName,
                       (char **)0x7fecee,in_stack_ffffffffffffff58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char (*) [14])0x0;
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            bVar12 = false;
          }
          UVar14 = UVar14 + 1;
          if (GLAttribs->ArraySize <= UVar14) {
            return bVar12;
          }
        } while( true );
      }
      break;
    default:
      FormatString<char[40]>(&msg,(char (*) [40])"Unsupported shader resource range type.");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                 ,0x278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return true;
}

Assistant:

bool PipelineResourceSignatureGLImpl::DvpValidateCommittedResource(const ShaderResourcesGL::GLResourceAttribs& GLAttribs,
                                                                   RESOURCE_DIMENSION                          ResourceDim,
                                                                   bool                                        IsMultisample,
                                                                   Uint32                                      ResIndex,
                                                                   const ShaderResourceCacheGL&                ResourceCache,
                                                                   const char*                                 ShaderName,
                                                                   const char*                                 PSOName) const
{
    VERIFY_EXPR(ResIndex < m_Desc.NumResources);
    const auto& ResDesc = m_Desc.Resources[ResIndex];
    const auto& ResAttr = m_pResourceAttribs[ResIndex];
    VERIFY(strcmp(ResDesc.Name, GLAttribs.Name) == 0, "Inconsistent resource names");

    if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
        return true; // Skip separate samplers

    VERIFY_EXPR(GLAttribs.ArraySize <= ResDesc.ArraySize);

    bool BindingsOK = true;

    static_assert(BINDING_RANGE_COUNT == 4, "Please update the switch below to handle the new shader resource range");
    switch (PipelineResourceToBindingRange(ResDesc))
    {
        case BINDING_RANGE_UNIFORM_BUFFER:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                if (!ResourceCache.IsUBBound(ResAttr.CacheOffset + ArrInd))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                }
            }
            break;

        case BINDING_RANGE_STORAGE_BUFFER:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                if (!ResourceCache.IsSSBOBound(ResAttr.CacheOffset + ArrInd))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                }
            }
            break;

        case BINDING_RANGE_TEXTURE:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                const bool IsTexView = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT);
                if (!ResourceCache.IsTextureBound(ResAttr.CacheOffset + ArrInd, IsTexView))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                    continue;
                }

                const auto& Tex = ResourceCache.GetConstTexture(ResAttr.CacheOffset + ArrInd);
                if (Tex.pTexture)
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Tex.pView.RawPtr<ITextureView>(), ResourceDim, IsMultisample);
                else
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Tex.pView.RawPtr<IBufferView>(), ResourceDim, IsMultisample);

                const auto ImmutableSamplerIdx = GetImmutableSamplerIdx(ResAttr);
                if (ImmutableSamplerIdx != InvalidImmutableSamplerIndex)
                {
                    VERIFY(Tex.pSampler != nullptr, "Immutable sampler is not initialized in the cache - this is a bug");
                    VERIFY(Tex.pSampler == m_pImmutableSamplers[ImmutableSamplerIdx], "Immutable sampler initialized in the cache is not valid");
                }
            }
            break;

        case BINDING_RANGE_IMAGE:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                const bool IsTexView = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV);
                if (!ResourceCache.IsImageBound(ResAttr.CacheOffset + ArrInd, IsTexView))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                    continue;
                }

                const auto& Img = ResourceCache.GetConstImage(ResAttr.CacheOffset + ArrInd);
                if (Img.pTexture)
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Img.pView.RawPtr<ITextureView>(), ResourceDim, IsMultisample);
                else
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Img.pView.RawPtr<IBufferView>(), ResourceDim, IsMultisample);
            }
            break;

        default:
            UNEXPECTED("Unsupported shader resource range type.");
    }

    return BindingsOK;
}